

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_decompress.c
# Opt level: O2

size_t FSE_buildDTable_internal
                 (FSE_DTable *dt,short *normalizedCounter,uint maxSymbolValue,uint tableLog,
                 void *workSpace,size_t wkspSize)

{
  uint uVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  long lVar5;
  short sVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  undefined2 uVar11;
  uint uVar12;
  size_t u;
  long lVar13;
  ushort uVar14;
  ulong uVar15;
  long lVar16;
  U32 s;
  ulong uVar17;
  long lVar18;
  size_t sStack_50;
  
  bVar2 = (byte)tableLog;
  uVar1 = 1 << (bVar2 & 0x1f);
  sStack_50 = 0xffffffffffffffd2;
  if ((maxSymbolValue < 0x100) &&
     (uVar9 = (ulong)(maxSymbolValue + 1), (1L << (bVar2 & 0x3f)) + uVar9 * 2 + 8 <= wkspSize)) {
    if (tableLog < 0xd) {
      lVar5 = (long)workSpace + (ulong)maxSymbolValue * 2 + 2;
      uVar7 = uVar1 - 1;
      uVar11 = 1;
      uVar4 = uVar7;
      for (uVar17 = 0; uVar9 != uVar17; uVar17 = uVar17 + 1) {
        sVar6 = normalizedCounter[uVar17];
        if (sVar6 == -1) {
          uVar15 = (ulong)uVar4;
          uVar4 = uVar4 - 1;
          *(char *)((long)dt + uVar15 * 4 + 6) = (char)uVar17;
          sVar6 = 1;
        }
        else if ((int)((uint)(0x8000 << (bVar2 & 0x1f)) >> 0x10) <= (int)sVar6) {
          uVar11 = 0;
        }
        *(short *)((long)workSpace + uVar17 * 2) = sVar6;
      }
      *(short *)dt = (short)tableLog;
      *(undefined2 *)((long)dt + 2) = uVar11;
      iVar8 = (uVar1 >> 1) + (uVar1 >> 3) + 3;
      if (uVar4 == uVar7) {
        lVar18 = 0;
        lVar16 = 0;
        for (uVar17 = 0; uVar17 != uVar9; uVar17 = uVar17 + 1) {
          sVar6 = normalizedCounter[uVar17];
          *(long *)(lVar5 + lVar16) = lVar18;
          for (lVar13 = 8; lVar13 < sVar6; lVar13 = lVar13 + 8) {
            *(long *)((long)workSpace + lVar13 + lVar16 + (ulong)maxSymbolValue * 2 + 2) = lVar18;
          }
          lVar16 = lVar16 + sVar6;
          lVar18 = lVar18 + 0x101010101010101;
        }
        if ((uVar1 & 1) != 0) {
          __assert_fail("tableSize % unroll == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/common/fse_decompress.c"
                        ,0x7f,
                        "size_t FSE_buildDTable_internal(FSE_DTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                       );
        }
        uVar4 = 0;
        for (uVar9 = 0; uVar9 < uVar1; uVar9 = uVar9 + 2) {
          uVar10 = uVar4;
          for (lVar16 = 0; lVar16 != 2; lVar16 = lVar16 + 1) {
            *(undefined1 *)((long)dt + (ulong)(uVar10 & uVar7) * 4 + 6) =
                 *(undefined1 *)(lVar5 + lVar16);
            uVar10 = uVar10 + iVar8;
          }
          uVar4 = uVar4 + iVar8 * 2 & uVar7;
          lVar5 = lVar5 + 2;
        }
        if (uVar4 != 0) {
          __assert_fail("position == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/common/fse_decompress.c"
                        ,0x88,
                        "size_t FSE_buildDTable_internal(FSE_DTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                       );
        }
      }
      else {
        uVar10 = 0;
        for (uVar17 = 0; uVar17 != uVar9; uVar17 = uVar17 + 1) {
          uVar14 = normalizedCounter[uVar17];
          uVar12 = 0;
          if ((short)uVar14 < 1) {
            uVar14 = 0;
          }
          for (; uVar12 != uVar14; uVar12 = uVar12 + 1) {
            *(char *)((long)dt + (ulong)uVar10 * 4 + 6) = (char)uVar17;
            do {
              uVar10 = uVar10 + iVar8 & uVar7;
            } while (uVar4 < uVar10);
          }
        }
        if (uVar10 != 0) {
          return 0xffffffffffffffff;
        }
      }
      sStack_50 = 0;
      for (uVar9 = 0; uVar1 != uVar9; uVar9 = uVar9 + 1) {
        uVar17 = (ulong)*(byte *)((long)dt + uVar9 * 4 + 6);
        uVar14 = *(ushort *)((long)workSpace + uVar17 * 2);
        *(ushort *)((long)workSpace + uVar17 * 2) = uVar14 + 1;
        uVar4 = ZSTD_highbit32((uint)uVar14);
        bVar3 = bVar2 - (char)uVar4;
        *(byte *)((long)dt + uVar9 * 4 + 7) = bVar3;
        *(ushort *)(dt + uVar9 + 1) = (uVar14 << (bVar3 & 0x1f)) - (short)uVar1;
      }
    }
    else {
      sStack_50 = 0xffffffffffffffd4;
    }
  }
  return sStack_50;
}

Assistant:

static size_t FSE_buildDTable_internal(FSE_DTable* dt, const short* normalizedCounter, unsigned maxSymbolValue, unsigned tableLog, void* workSpace, size_t wkspSize)
{
    void* const tdPtr = dt+1;   /* because *dt is unsigned, 32-bits aligned on 32-bits */
    FSE_DECODE_TYPE* const tableDecode = (FSE_DECODE_TYPE*) (tdPtr);
    U16* symbolNext = (U16*)workSpace;
    BYTE* spread = (BYTE*)(symbolNext + maxSymbolValue + 1);

    U32 const maxSV1 = maxSymbolValue + 1;
    U32 const tableSize = 1 << tableLog;
    U32 highThreshold = tableSize-1;

    /* Sanity Checks */
    if (FSE_BUILD_DTABLE_WKSP_SIZE(tableLog, maxSymbolValue) > wkspSize) return ERROR(maxSymbolValue_tooLarge);
    if (maxSymbolValue > FSE_MAX_SYMBOL_VALUE) return ERROR(maxSymbolValue_tooLarge);
    if (tableLog > FSE_MAX_TABLELOG) return ERROR(tableLog_tooLarge);

    /* Init, lay down lowprob symbols */
    {   FSE_DTableHeader DTableH;
        DTableH.tableLog = (U16)tableLog;
        DTableH.fastMode = 1;
        {   S16 const largeLimit= (S16)(1 << (tableLog-1));
            U32 s;
            for (s=0; s<maxSV1; s++) {
                if (normalizedCounter[s]==-1) {
                    tableDecode[highThreshold--].symbol = (FSE_FUNCTION_TYPE)s;
                    symbolNext[s] = 1;
                } else {
                    if (normalizedCounter[s] >= largeLimit) DTableH.fastMode=0;
                    symbolNext[s] = normalizedCounter[s];
        }   }   }
        ZSTD_memcpy(dt, &DTableH, sizeof(DTableH));
    }

    /* Spread symbols */
    if (highThreshold == tableSize - 1) {
        size_t const tableMask = tableSize-1;
        size_t const step = FSE_TABLESTEP(tableSize);
        /* First lay down the symbols in order.
         * We use a uint64_t to lay down 8 bytes at a time. This reduces branch
         * misses since small blocks generally have small table logs, so nearly
         * all symbols have counts <= 8. We ensure we have 8 bytes at the end of
         * our buffer to handle the over-write.
         */
        {
            U64 const add = 0x0101010101010101ull;
            size_t pos = 0;
            U64 sv = 0;
            U32 s;
            for (s=0; s<maxSV1; ++s, sv += add) {
                int i;
                int const n = normalizedCounter[s];
                MEM_write64(spread + pos, sv);
                for (i = 8; i < n; i += 8) {
                    MEM_write64(spread + pos + i, sv);
                }
                pos += n;
            }
        }
        /* Now we spread those positions across the table.
         * The benefit of doing it in two stages is that we avoid the
         * variable size inner loop, which caused lots of branch misses.
         * Now we can run through all the positions without any branch misses.
         * We unroll the loop twice, since that is what empirically worked best.
         */
        {
            size_t position = 0;
            size_t s;
            size_t const unroll = 2;
            assert(tableSize % unroll == 0); /* FSE_MIN_TABLELOG is 5 */
            for (s = 0; s < (size_t)tableSize; s += unroll) {
                size_t u;
                for (u = 0; u < unroll; ++u) {
                    size_t const uPosition = (position + (u * step)) & tableMask;
                    tableDecode[uPosition].symbol = spread[s + u];
                }
                position = (position + (unroll * step)) & tableMask;
            }
            assert(position == 0);
        }
    } else {
        U32 const tableMask = tableSize-1;
        U32 const step = FSE_TABLESTEP(tableSize);
        U32 s, position = 0;
        for (s=0; s<maxSV1; s++) {
            int i;
            for (i=0; i<normalizedCounter[s]; i++) {
                tableDecode[position].symbol = (FSE_FUNCTION_TYPE)s;
                position = (position + step) & tableMask;
                while (position > highThreshold) position = (position + step) & tableMask;   /* lowprob area */
        }   }
        if (position!=0) return ERROR(GENERIC);   /* position must reach all cells once, otherwise normalizedCounter is incorrect */
    }

    /* Build Decoding table */
    {   U32 u;
        for (u=0; u<tableSize; u++) {
            FSE_FUNCTION_TYPE const symbol = (FSE_FUNCTION_TYPE)(tableDecode[u].symbol);
            U32 const nextState = symbolNext[symbol]++;
            tableDecode[u].nbBits = (BYTE) (tableLog - ZSTD_highbit32(nextState) );
            tableDecode[u].newState = (U16) ( (nextState << tableDecode[u].nbBits) - tableSize);
    }   }

    return 0;
}